

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O3

CBBox * __thiscall CDesign::GetStartBox(CBBox *__return_storage_ptr__,CDesign *this,int *pNumEdge)

{
  long lVar1;
  pointer piVar2;
  pointer piVar3;
  CLayer *this_00;
  ulong uVar4;
  int iVar5;
  int iY;
  uint uVar6;
  uint uVar7;
  int iVar8;
  vector<int,_std::allocator<int>_> X;
  vector<int,_std::allocator<int>_> Y;
  CPoint PointE;
  CPoint PointS;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  CPoint local_80;
  CPoint local_58;
  
  iVar8 = 0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((this->super_CBBox).m_cMinZ < (this->super_CBBox).m_cMaxZ) {
    do {
      iVar8 = iVar8 + 1;
      this_00 = GetLayer(this,iVar8);
      CLayer::GetStartBox(this_00,&local_b8,&local_98);
      piVar3 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar2 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (iVar8 < (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ);
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar4 = (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar2,piVar3);
    }
  }
  piVar3 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar4 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar2,piVar3);
  }
  if ((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    uVar6 = ((int)(this->super_CBBox).m_iMaxX - (int)(this->super_CBBox).m_iMinX) / 2;
  }
  else {
    uVar6 = *(uint *)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     ((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffcU));
  }
  if ((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    iVar8 = ((int)(this->super_CBBox).m_iMaxY - (int)(this->super_CBBox).m_iMinY) / 2;
  }
  else {
    iVar8 = *(int *)((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start +
                    ((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffffcU));
  }
  CObject::Display(0,"(%d,%d) predicted as the most congestion region\n",(ulong)uVar6);
  CPoint::CPoint(&local_58);
  CPoint::CPoint(&local_80);
  uVar7 = 1;
  if (1 < (int)uVar6) {
    uVar7 = uVar6;
  }
  iVar5 = 1;
  if (1 < iVar8) {
    iVar5 = iVar8;
  }
  CPoint::SetXYZ(&local_58,uVar7 - 1,iVar5 + -1,0);
  iVar5 = this->m_iSizeX + -1;
  if ((int)(uVar6 + 1) < this->m_iSizeX) {
    iVar5 = uVar6 + 1;
  }
  iY = this->m_iSizeY + -1;
  if (iVar8 + 1 < this->m_iSizeY) {
    iY = iVar8 + 1;
  }
  CPoint::SetXYZ(&local_80,iVar5,iY,
                 (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ);
  CBBox::CBBox(__return_storage_ptr__);
  CBBox::Initialize(__return_storage_ptr__,&local_58,&local_80);
  if (pNumEdge != (int *)0x0) {
    *pNumEdge = (int)((ulong)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
  }
  CPoint::~CPoint(&local_80);
  CPoint::~CPoint(&local_58);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

CBBox CDesign::GetStartBox(int* pNumEdge)
{
	//!compute the starting point of box expansion, based on the # of pins.
	//!it also can be done any congestion analysis.

	vector<int>	X;
	vector<int>	Y;

	for(int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetStartBox(&X,&Y);


	sort(X.begin(),X.end());
	sort(Y.begin(),Y.end());

	int	iStartX		=	X.size()? X[X.size()/2]:W()/2;
	int	iStartY		=	Y.size()? Y[Y.size()/2]:H()/2;

	Display(DISPLAY_MODE_INFO,"(%d,%d) predicted as the most congestion region\n",iStartX,iStartY);

	CPoint	PointS;
	CPoint	PointE;

	PointS.SetXYZ(MAX(0,iStartX-1),MAX(0,iStartY-1),0);
	PointE.SetXYZ(MIN(m_iSizeX-1,iStartX+1),MIN(m_iSizeY-1,iStartY+1),T());

	CBBox	BBox;

	BBox.Initialize(&PointS,&PointE);

	if(pNumEdge)	*pNumEdge = X.size();
	return	BBox;
}